

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reldtfmt.cpp
# Opt level: O0

void __thiscall icu_63::RelativeDateFormat::loadDates(RelativeDateFormat *this,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  char *localeID;
  UResourceBundle *pUVar3;
  SimpleFormatter *this_00;
  URelativeString *pUVar4;
  undefined6 *size;
  SimpleFormatter *local_110;
  undefined1 local_c8 [8];
  RelDateFmtDataSink sink;
  ConstChar16Ptr local_a8;
  UnicodeString local_a0;
  undefined1 local_59;
  SimpleFormatter *local_58;
  UChar *local_50;
  UChar *resStr;
  uint local_40;
  int32_t offsetIncrement;
  int32_t glueIndex;
  int32_t resStrLen;
  int32_t patternsSize;
  LocalPointerBase<UResourceBundle> local_28;
  LocalUResourceBundlePointer dateTimePatterns;
  UResourceBundle *rb;
  UErrorCode *status_local;
  RelativeDateFormat *this_local;
  
  localeID = Locale::getBaseName(&this->fLocale);
  dateTimePatterns.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)ures_open_63((char *)0x0,localeID,status);
  pUVar3 = ures_getByKeyWithFallback_63
                     ((UResourceBundle *)
                      dateTimePatterns.super_LocalPointerBase<UResourceBundle>.ptr,
                      "calendar/gregorian/DateTimePatterns",(UResourceBundle *)0x0,status);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_28,pUVar3);
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    pUVar3 = LocalPointerBase<UResourceBundle>::getAlias(&local_28);
    glueIndex = ures_getSize_63(pUVar3);
    if (8 < glueIndex) {
      offsetIncrement = 0;
      local_40 = 8;
      if (((0xc < glueIndex) &&
          (resStr._4_4_ = this->fDateStyle & ~UDAT_FULL_RELATIVE, UDAT_NONE < resStr._4_4_)) &&
         (resStr._4_4_ < 0x84)) {
        local_40 = resStr._4_4_ + 9;
      }
      pUVar3 = LocalPointerBase<UResourceBundle>::getAlias(&local_28);
      size = (undefined6 *)(ulong)local_40;
      local_50 = ures_getStringByIndex_63(pUVar3,local_40,&offsetIncrement,status);
      UVar1 = ::U_SUCCESS(*status);
      if ((UVar1 != '\0') && (2 < offsetIncrement)) {
        size = &patItem1;
        iVar2 = u_strncmp_63(local_50,
                             L"{1}㙎捩彵㌶㠱敒慬楴敶慄整潆浲瑡E㙎捩彵㌶㈱䝟佌䅂彌也ㅟ㠱敒䑬瑡䙥瑭慄慴楓歮E"
                             ,3);
        if (iVar2 == 0) {
          this->fCombinedHasDateAtStart = '\x01';
        }
      }
      this_00 = (SimpleFormatter *)UMemory::operator_new((UMemory *)0x48,(size_t)size);
      sink._23_1_ = 0;
      sink._22_1_ = 0;
      local_110 = (SimpleFormatter *)0x0;
      if (this_00 != (SimpleFormatter *)0x0) {
        local_59 = 1;
        local_58 = this_00;
        ConstChar16Ptr::ConstChar16Ptr(&local_a8,local_50);
        sink._23_1_ = 1;
        icu_63::UnicodeString::UnicodeString(&local_a0,'\x01',&local_a8,offsetIncrement);
        sink._22_1_ = 1;
        SimpleFormatter::SimpleFormatter(this_00,&local_a0,2,2,status);
        local_110 = this_00;
      }
      local_59 = 0;
      this->fCombinedFormat = local_110;
      if ((sink._22_1_ & 1) != 0) {
        icu_63::UnicodeString::~UnicodeString(&local_a0);
      }
      if ((sink._23_1_ & 1) != 0) {
        ConstChar16Ptr::~ConstChar16Ptr(&local_a8);
      }
    }
  }
  this->fDatesLen = 6;
  pUVar4 = (URelativeString *)uprv_malloc_63((long)this->fDatesLen << 4);
  this->fDates = pUVar4;
  anon_unknown_20::RelDateFmtDataSink::RelDateFmtDataSink
            ((RelDateFmtDataSink *)local_c8,this->fDates,this->fDatesLen);
  ures_getAllItemsWithFallback_63
            ((UResourceBundle *)dateTimePatterns.super_LocalPointerBase<UResourceBundle>.ptr,
             "fields/day/relative",(ResourceSink *)local_c8,status);
  ures_close_63((UResourceBundle *)dateTimePatterns.super_LocalPointerBase<UResourceBundle>.ptr);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 != '\0') {
    this->fDatesLen = 0;
  }
  anon_unknown_20::RelDateFmtDataSink::~RelDateFmtDataSink((RelDateFmtDataSink *)local_c8);
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_28);
  return;
}

Assistant:

void RelativeDateFormat::loadDates(UErrorCode &status) {
    UResourceBundle *rb = ures_open(NULL, fLocale.getBaseName(), &status);
    LocalUResourceBundlePointer dateTimePatterns(
        ures_getByKeyWithFallback(rb,
                                  "calendar/gregorian/DateTimePatterns",
                                  (UResourceBundle*)NULL, &status));
    if(U_SUCCESS(status)) {
        int32_t patternsSize = ures_getSize(dateTimePatterns.getAlias());
        if (patternsSize > kDateTime) {
            int32_t resStrLen = 0;
            int32_t glueIndex = kDateTime;
            if (patternsSize >= (kDateTimeOffset + kShort + 1)) {
                int32_t offsetIncrement = (fDateStyle & ~kRelative); // Remove relative bit.
                if (offsetIncrement >= (int32_t)kFull &&
                    offsetIncrement <= (int32_t)kShortRelative) {
                    glueIndex = kDateTimeOffset + offsetIncrement;
                }
            }

            const UChar *resStr = ures_getStringByIndex(dateTimePatterns.getAlias(), glueIndex, &resStrLen, &status);
            if (U_SUCCESS(status) && resStrLen >= patItem1Len && u_strncmp(resStr,patItem1,patItem1Len)==0) {
                fCombinedHasDateAtStart = TRUE;
            }
            fCombinedFormat = new SimpleFormatter(UnicodeString(TRUE, resStr, resStrLen), 2, 2, status);
        }
    }

    // Data loading for relative names, e.g., "yesterday", "today", "tomorrow".
    fDatesLen = UDAT_DIRECTION_COUNT; // Maximum defined by data.
    fDates = (URelativeString*) uprv_malloc(sizeof(fDates[0])*fDatesLen);

    RelDateFmtDataSink sink(fDates, fDatesLen);
    ures_getAllItemsWithFallback(rb, "fields/day/relative", sink, status);

    ures_close(rb);

    if(U_FAILURE(status)) {
        fDatesLen=0;
        return;
    }
}